

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O0

QVector<int> * __thiscall
InsertProxyModelPrivate::setDataInContainer
          (QVector<int> *__return_storage_ptr__,InsertProxyModelPrivate *this,
          RolesContainer *baseHash,int role,QVariant *value)

{
  bool bVar1;
  int *piVar2;
  QVariant *pQVar3;
  const_iterator local_90;
  iterator local_88;
  iterator local_80;
  iterator local_78;
  iterator dataIter;
  const_iterator local_68;
  const_iterator adjRole;
  undefined1 local_50 [8];
  QVector<int> adjRoles;
  QVariant *value_local;
  int role_local;
  RolesContainer *baseHash_local;
  InsertProxyModelPrivate *this_local;
  QVector<int> *changedRoles;
  
  adjRoles.d.size._7_1_ = 0;
  QList<int>::QList(__return_storage_ptr__);
  QList<int>::QList((QList<int> *)local_50);
  QList<int>::reserve((QList<int> *)local_50,2);
  QList<int>::reserve(__return_storage_ptr__,2);
  QList<int>::append((QList<int> *)local_50,role);
  if (((this->m_separateEditDisplay & 1U) == 0) && ((role == 0 || (role == 2)))) {
    QList<int>::append((QList<int> *)local_50,(uint)(role == 0) * 2);
  }
  local_68 = QList<int>::cbegin((QList<int> *)local_50);
  while( true ) {
    dataIter.i._M_node = (iterator)QList<int>::cend((QList<int> *)local_50);
    bVar1 = QList<int>::const_iterator::operator!=(&local_68,(const_iterator)dataIter.i._M_node);
    if (!bVar1) break;
    piVar2 = QList<int>::const_iterator::operator*(&local_68);
    local_78._M_node = (_Base_ptr)QMap<int,_QVariant>::find(baseHash,piVar2);
    local_80._M_node = (_Base_ptr)QMap<int,_QVariant>::end(baseHash);
    bVar1 = ::operator==((iterator *)&local_78,(iterator *)&local_80);
    if (bVar1) {
      bVar1 = ::QVariant::isValid(value);
      if (bVar1) {
        piVar2 = QList<int>::const_iterator::operator*(&local_68);
        local_88._M_node = (_Base_ptr)QMap<int,_QVariant>::insert(baseHash,piVar2,value);
        piVar2 = QList<int>::const_iterator::operator*(&local_68);
        QList<int>::append(__return_storage_ptr__,*piVar2);
      }
    }
    else {
      bVar1 = ::QVariant::isValid(value);
      if (bVar1) {
        pQVar3 = QMap<int,_QVariant>::iterator::value((iterator *)&local_78);
        bVar1 = ::operator!=(pQVar3,value);
        if (bVar1) {
          pQVar3 = QMap<int,_QVariant>::iterator::value((iterator *)&local_78);
          ::QVariant::operator=(pQVar3,(QVariant *)value);
          piVar2 = QList<int>::const_iterator::operator*(&local_68);
          QList<int>::append(__return_storage_ptr__,*piVar2);
        }
      }
      else {
        QMap<int,_QVariant>::const_iterator::const_iterator(&local_90,(iterator *)&local_78);
        QMap<int,_QVariant>::erase(baseHash,local_90);
        piVar2 = QList<int>::const_iterator::operator*(&local_68);
        QList<int>::append(__return_storage_ptr__,*piVar2);
      }
    }
    QList<int>::const_iterator::operator++(&local_68);
  }
  adjRoles.d.size._7_1_ = 1;
  QList<int>::~QList((QList<int> *)local_50);
  if ((adjRoles.d.size._7_1_ & 1) == 0) {
    QList<int>::~QList(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QVector<int> InsertProxyModelPrivate::setDataInContainer(RolesContainer &baseHash, int role, const QVariant &value)
{
    QVector<int> changedRoles;
    QVector<int> adjRoles;
    adjRoles.reserve(2);
    changedRoles.reserve(2);
    adjRoles.append(role);
    if ((!m_separateEditDisplay) && (role == Qt::DisplayRole || role == Qt::EditRole))
        adjRoles.append(role == Qt::DisplayRole ? Qt::EditRole : Qt::DisplayRole);
    for (auto adjRole = adjRoles.cbegin(); adjRole != adjRoles.cend(); ++adjRole) {
        const auto dataIter = baseHash.find(*adjRole);
        if (dataIter == baseHash.end()) {
            if (!value.isValid())
                continue;
            baseHash.insert(*adjRole, value);
            changedRoles.append(*adjRole);
        } else {
            Q_ASSERT(dataIter.value().isValid());
            if (!value.isValid()) {
                baseHash.erase(dataIter);
                changedRoles.append(*adjRole);
            } else {
                if (dataIter.value() != value) {
                    dataIter.value() = value;
                    changedRoles.append(*adjRole);
                }
            }
        }
    }
    return changedRoles;
}